

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  if (count != 0) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if (*local_c0 != 0) {
        uVar6 = (ulong)*(uint *)(*local_c0 + uVar5 * 4);
      }
      if ((local_b0 == 0) || ((*(ulong *)(local_b0 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0))
      {
        uVar2 = uVar5;
        if (*local_78 != 0) {
          uVar2 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
        }
        plVar1 = *(long **)(local_70 + uVar2 * 8);
        if (*plVar1 == 0) {
          puVar3 = (undefined8 *)operator_new(0x30);
          puVar3[2] = 0;
          puVar3[3] = 0;
          puVar3[4] = 0;
          puVar3[5] = 0;
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3[3] = puVar3 + 1;
          puVar3[4] = puVar3 + 1;
          puVar3[5] = 0;
          *plVar1 = (long)puVar3;
        }
        pmVar4 = std::
                 map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                 ::operator[]((map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                               *)*plVar1,(key_type_conflict2 *)(local_b8 + uVar6 * 2));
        *pmVar4 = *pmVar4 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}